

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeFinishMoveto(VdbeCursor *p)

{
  long lVar1;
  long in_FS_OFFSET;
  int *unaff_retaddr;
  int rc;
  BtCursor *in_stack_00000018;
  int res;
  int local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = sqlite3BtreeTableMoveto(in_stack_00000018,(i64)p,rc,unaff_retaddr);
  if (local_10 == 0) {
    local_10 = sqlite3CorruptError(0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_NOINLINE sqlite3VdbeFinishMoveto(VdbeCursor *p){
  int res, rc;
#ifdef SQLITE_TEST
  extern int sqlite3_search_count;
#endif
  assert( p->deferredMoveto );
  assert( p->isTable );
  assert( p->eCurType==CURTYPE_BTREE );
  rc = sqlite3BtreeTableMoveto(p->uc.pCursor, p->movetoTarget, 0, &res);
  if( rc ) return rc;
  if( res!=0 ) return SQLITE_CORRUPT_BKPT;
#ifdef SQLITE_TEST
  sqlite3_search_count++;
#endif
  p->deferredMoveto = 0;
  p->cacheStatus = CACHE_STALE;
  return SQLITE_OK;
}